

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O2

void __thiscall CConsoleNetConnection::Disconnect(CConsoleNetConnection *this,char *pReason)

{
  if (this->m_State != 0) {
    if ((pReason != (char *)0x0) && (*pReason != '\0')) {
      Send(this,pReason);
    }
    net_tcp_close(this->m_Socket);
    Reset(this);
    return;
  }
  return;
}

Assistant:

void CConsoleNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(pReason && pReason[0])
		Send(pReason);

	net_tcp_close(m_Socket);

	Reset();
}